

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

void prvTidyFreeAttrs(TidyDocImpl *doc,Node *node)

{
  AttVal *av_00;
  Attribute *pAVar1;
  Bool BVar2;
  AttVal *av;
  
  av_00 = node->attributes;
  while (av_00 != (AttVal *)0x0) {
    if ((((av_00->attribute != (tmbstr)0x0) && (pAVar1 = av_00->dict, pAVar1 != (Attribute *)0x0))
        && ((pAVar1->id == TidyAttr_ID ||
            ((pAVar1 != (Attribute *)0x0 && (pAVar1->id == TidyAttr_NAME)))))) &&
       (BVar2 = prvTidyIsAnchorElement(doc,node), BVar2 != no)) {
      prvTidyRemoveAnchorByNode(doc,av_00->value,node);
    }
    node->attributes = av_00->next;
    prvTidyFreeAttribute(doc,av_00);
    av_00 = node->attributes;
  }
  return;
}

Assistant:

void TY_(FreeAttrs)( TidyDocImpl* doc, Node *node )
{
    while ( node->attributes )
    {
        AttVal *av = node->attributes;

        if ( av->attribute )
        {
            if ( (attrIsID(av) || attrIsNAME(av)) &&
                 TY_(IsAnchorElement)(doc, node) )
            {
                TY_(RemoveAnchorByNode)( doc, av->value, node );
            }
        }

        node->attributes = av->next;
        TY_(FreeAttribute)( doc, av );
    }
}